

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

void __thiscall
QAccessibleTableCell::QAccessibleTableCell
          (QAccessibleTableCell *this,QAbstractItemView *view_,QModelIndex *index_,Role role_)

{
  bool bVar1;
  QDebug *pQVar2;
  long in_FS_OFFSET;
  QDebug local_48;
  Stream *local_40;
  undefined1 local_38 [8];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_30;
  
  local_30.ptr = *(QAbstractItemModel **)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR__QAccessibleTableCell_007e44e8;
  *(undefined ***)&this->super_QAccessibleTableCellInterface = &PTR__QAccessibleTableCell_007e45f8;
  *(undefined ***)&this->super_QAccessibleActionInterface = &PTR__QAccessibleTableCell_007e4658;
  QPointer<QAbstractItemView>::QPointer<void>(&this->view,view_);
  QPersistentModelIndex::QPersistentModelIndex(&this->m_index,index_);
  this->m_role = role_;
  bVar1 = QModelIndex::isValid(index_);
  if (!bVar1) {
    QMessageLogger::warning();
    pQVar2 = QDebug::operator<<(&local_48,
                                "QAccessibleTableCell::QAccessibleTableCell with invalid index: ");
    local_40 = pQVar2->stream;
    *(int *)(local_40 + 0x28) = *(int *)(local_40 + 0x28) + 1;
    ::operator<<((Stream *)local_38,(QModelIndex *)&local_40);
    QDebug::~QDebug((QDebug *)local_38);
    QDebug::~QDebug((QDebug *)&local_40);
    QDebug::~QDebug(&local_48);
  }
  if (*(QAbstractItemModel **)(in_FS_OFFSET + 0x28) == local_30.ptr) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleTableCell::QAccessibleTableCell(QAbstractItemView *view_, const QModelIndex &index_, QAccessible::Role role_)
    : /* QAccessibleSimpleEditableTextInterface(this), */ view(view_), m_index(index_), m_role(role_)
{
    if (Q_UNLIKELY(!index_.isValid()))
        qWarning() << "QAccessibleTableCell::QAccessibleTableCell with invalid index: " << index_;
}